

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

image * __thiscall basisu::image::swap(image *this,image *other)

{
  uint32_t uVar1;
  color_rgba *pcVar2;
  
  uVar1 = this->m_width;
  this->m_width = other->m_width;
  other->m_width = uVar1;
  uVar1 = this->m_height;
  this->m_height = other->m_height;
  other->m_height = uVar1;
  uVar1 = this->m_pitch;
  this->m_pitch = other->m_pitch;
  other->m_pitch = uVar1;
  pcVar2 = (this->m_pixels).m_p;
  (this->m_pixels).m_p = (other->m_pixels).m_p;
  (other->m_pixels).m_p = pcVar2;
  uVar1 = (this->m_pixels).m_size;
  (this->m_pixels).m_size = (other->m_pixels).m_size;
  (other->m_pixels).m_size = uVar1;
  uVar1 = (this->m_pixels).m_capacity;
  (this->m_pixels).m_capacity = (other->m_pixels).m_capacity;
  (other->m_pixels).m_capacity = uVar1;
  return this;
}

Assistant:

image &swap(image &other)
		{
			std::swap(m_width, other.m_width);
			std::swap(m_height, other.m_height);
			std::swap(m_pitch, other.m_pitch);
			m_pixels.swap(other.m_pixels);
			return *this;
		}